

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void cross_validation(problem *prob,parameter *param,int nr_fold,double *target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  double dVar5;
  model *local_88;
  model *submodel;
  problem subprob;
  int local_58;
  int k;
  int j_1;
  int end;
  int begin;
  int j;
  int *perm;
  int l;
  int *fold_start;
  int i;
  double *target_local;
  int nr_fold_local;
  parameter *param_local;
  problem *prob_local;
  
  iVar1 = prob->l;
  __ptr = malloc((long)iVar1 << 2);
  target_local._4_4_ = nr_fold;
  if (iVar1 < nr_fold) {
    fprintf(_stderr,
            "WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n"
           );
    target_local._4_4_ = iVar1;
  }
  __ptr_00 = malloc((long)(target_local._4_4_ + 1) << 2);
  for (fold_start._4_4_ = 0; fold_start._4_4_ < iVar1; fold_start._4_4_ = fold_start._4_4_ + 1) {
    *(int *)((long)__ptr + (long)fold_start._4_4_ * 4) = fold_start._4_4_;
  }
  for (fold_start._4_4_ = 0; fold_start._4_4_ < iVar1; fold_start._4_4_ = fold_start._4_4_ + 1) {
    iVar4 = rand();
    swap<int>((int *)((long)__ptr + (long)fold_start._4_4_ * 4),
              (int *)((long)__ptr +
                     (long)(fold_start._4_4_ + iVar4 % (iVar1 - fold_start._4_4_)) * 4));
  }
  for (fold_start._4_4_ = 0; fold_start._4_4_ <= target_local._4_4_;
      fold_start._4_4_ = fold_start._4_4_ + 1) {
    *(int *)((long)__ptr_00 + (long)fold_start._4_4_ * 4) =
         (fold_start._4_4_ * iVar1) / target_local._4_4_;
  }
  for (fold_start._4_4_ = 0; fold_start._4_4_ < target_local._4_4_;
      fold_start._4_4_ = fold_start._4_4_ + 1) {
    iVar4 = *(int *)((long)__ptr_00 + (long)fold_start._4_4_ * 4);
    iVar2 = *(int *)((long)__ptr_00 + (long)(fold_start._4_4_ + 1) * 4);
    subprob.x = (feature_node **)prob->bias;
    submodel._4_4_ = prob->n;
    submodel._0_4_ = iVar1 - (iVar2 - iVar4);
    subprob.y = (double *)malloc((long)(int)submodel << 3);
    subprob._0_8_ = malloc((long)(int)submodel << 3);
    subprob.bias._4_4_ = 0;
    for (local_58 = 0; iVar3 = iVar2, local_58 < iVar4; local_58 = local_58 + 1) {
      subprob.y[subprob.bias._4_4_] = (double)prob->x[*(int *)((long)__ptr + (long)local_58 * 4)];
      *(double *)(subprob._0_8_ + (long)subprob.bias._4_4_ * 8) =
           prob->y[*(int *)((long)__ptr + (long)local_58 * 4)];
      subprob.bias._4_4_ = subprob.bias._4_4_ + 1;
    }
    while (local_58 = iVar3, local_58 < iVar1) {
      subprob.y[subprob.bias._4_4_] = (double)prob->x[*(int *)((long)__ptr + (long)local_58 * 4)];
      *(double *)(subprob._0_8_ + (long)subprob.bias._4_4_ * 8) =
           prob->y[*(int *)((long)__ptr + (long)local_58 * 4)];
      subprob.bias._4_4_ = subprob.bias._4_4_ + 1;
      iVar3 = local_58 + 1;
    }
    local_88 = train((problem *)&submodel,param);
    for (local_58 = iVar4; local_58 < iVar2; local_58 = local_58 + 1) {
      dVar5 = predict(local_88,prob->x[*(int *)((long)__ptr + (long)local_58 * 4)]);
      target[*(int *)((long)__ptr + (long)local_58 * 4)] = dVar5;
    }
    free_and_destroy_model(&local_88);
    free(subprob.y);
    free((void *)subprob._0_8_);
  }
  free(__ptr_00);
  free(__ptr);
  return;
}

Assistant:

void cross_validation(const problem *prob, const parameter *param, int nr_fold, double *target)
{
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int,l);
	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;
		struct problem subprob;

		subprob.bias = prob->bias;
		subprob.n = prob->n;
		subprob.l = l-(end-begin);
		subprob.x = Malloc(struct feature_node*,subprob.l);
		subprob.y = Malloc(double,subprob.l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		struct model *submodel = train(&subprob,param);
		for(j=begin;j<end;j++)
			target[perm[j]] = predict(submodel,prob->x[perm[j]]);
		free_and_destroy_model(&submodel);
		free(subprob.x);
		free(subprob.y);
	}
	free(fold_start);
	free(perm);
}